

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.cpp
# Opt level: O1

void __thiscall http_server::inbound_connection::try_read(inbound_connection *this)

{
  client_socket *this_00;
  char *begin;
  size_t sVar1;
  char *pcVar2;
  string local_88;
  _Any_data local_68;
  code *local_58;
  undefined8 uStack_50;
  _Any_data local_48;
  code *local_38;
  undefined8 uStack_30;
  
  this_00 = &this->socket;
  sVar1 = client_socket::read_some
                    (this_00,this->request_buffer + this->request_received,
                     4000 - this->request_received);
  if (sVar1 != 0) {
    begin = this->request_buffer;
    pcVar2 = std::__search<char*,char*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                       (begin + (this->request_received - 3),begin + sVar1 + this->request_received,
                        &(anonymous_namespace)::crlf_crlf,&DAT_0011626c);
    sVar1 = this->request_received + sVar1;
    this->request_received = sVar1;
    if (pcVar2 == begin + sVar1) {
      if (sVar1 == 4000) {
        local_38 = (code *)0x0;
        uStack_30 = 0;
        local_48._M_unused._M_object = (void *)0x0;
        local_48._8_8_ = 0;
        client_socket::set_on_read(this_00,(on_ready_t *)&local_48);
        if (local_38 != (code *)0x0) {
          (*local_38)(&local_48,&local_48,__destroy_functor);
        }
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,"Bad Request: request is too large","");
        send_header(this,bad_request,&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
      }
    }
    else {
      local_58 = (code *)0x0;
      uStack_50 = 0;
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = 0;
      client_socket::set_on_read(this_00,(on_ready_t *)&local_68);
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,__destroy_functor);
      }
      new_request(this,begin,pcVar2 + 4);
    }
  }
  return;
}

Assistant:

void http_server::inbound_connection::try_read()
{
    size_t received_now = socket.read_some(request_buffer + request_received, sizeof request_buffer - request_received);
    if (received_now == 0)
        return;

    auto i = std::search(request_buffer + request_received - 3,
                         request_buffer + request_received + received_now,
                         std::begin(crlf_crlf),
                         std::end(crlf_crlf));

    request_received += received_now;
    if (i == request_buffer + request_received)
    {
        if (request_received == sizeof request_buffer)
        {
            socket.set_on_read(client_socket::on_ready_t{});
            send_header(http_status_code::bad_request, "Bad Request: request is too large");
        }

        return;
    }

    socket.set_on_read(client_socket::on_ready_t{});

    try
    {
        new_request(request_buffer, i + sizeof crlf_crlf);
    }
    catch (http_error const& e)
    {
        send_header(e.get_status_code(), e.get_reason_phrase());
    }
    catch (std::exception const& e)
    {
        // TODO: if something was already written to socket,
        // we should just drop the connection
        send_header(http_status_code::internal_server_error, e.what());
    }
}